

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

Uint32 __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd)

{
  _List_node_base *p_Var1;
  ConversionStream *this_00;
  int iVar2;
  char (*in_RCX) [36];
  char (*Args_1) [39];
  Uint32 UVar3;
  _List_node_base *p_Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string msg;
  string local_80;
  uint local_5c;
  String local_58;
  ConversionStream *local_38;
  
  if (*(int *)&Token->_M_node[1]._M_next != 0x135) {
    FormatString<char[26],char[36]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenParen",in_RCX);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x68a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var1 = ScopeEnd->_M_node;
  local_5c = *(uint *)&Token->_M_node[1]._M_next;
  Args_1 = (char (*) [39])(ulong)local_5c;
  UVar3 = 0;
  if (local_5c == 0x135) {
    Token->_M_node = Token->_M_node->_M_next;
  }
  uVar7 = (uint)(local_5c == 0x135);
  p_Var4 = Token->_M_node;
  uVar6 = uVar7;
  local_38 = this;
  if (p_Var4 != p_Var1) {
    UVar3 = 0;
    uVar5 = uVar7;
    do {
      if (*(int *)&p_Var4[1]._M_next == 0x136) {
        uVar6 = uVar5 - 1;
        if ((int)uVar5 <= (int)uVar7) break;
      }
      else {
        uVar6 = uVar5;
        if (*(int *)&p_Var4[1]._M_next == 0x135) {
          uVar6 = uVar5 + 1;
        }
      }
      UVar3 = UVar3 + (UVar3 == 0);
      if (uVar6 == 1) {
        iVar2 = std::__cxx11::string::compare((char *)&p_Var4[1]._M_prev);
        UVar3 = UVar3 + (iVar2 == 0);
      }
      p_Var4 = Token->_M_node->_M_next;
      Token->_M_node = p_Var4;
      uVar5 = uVar6;
    } while (p_Var4 != p_Var1);
  }
  this_00 = local_38;
  if (local_5c == 0x135) {
    if (p_Var4 == (_List_node_base *)&local_38->m_Tokens) {
      FormatString<char[38]>(&local_80,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_58,this_00,Token,4);
      Args_1 = (char (*) [39])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,&local_80,(char (*) [2])0x33bd33,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(int *)&Token->_M_node[1]._M_next == 0x136) goto LAB_001f1d8c;
    FormatString<char[26],char[32]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",(char (*) [32])Args_1);
    Args_1 = (char (*) [39])0xd1f;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (uVar6 == 0) goto LAB_001f1d8c;
    FormatString<char[20]>(&local_80,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_58,this_00,Token,4);
    Args_1 = (char (*) [39])0xd23;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,&local_80,(char (*) [2])0x33bd33,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
LAB_001f1d8c:
  if (Token->_M_node == (_List_node_base *)&this_00->m_Tokens) {
    FormatString<char[46]>(&local_80,(char (*) [46])"Unexpected EOF while processing argument list")
    ;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_58,this_00,Token,4);
    Args_1 = (char (*) [39])0x6a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a0,&local_80,(char (*) [2])0x33bd33,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(int *)&Token->_M_node[1]._M_next != 0x136) {
    FormatString<char[26],char[39]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ClosingParen",Args_1);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  Token->_M_node = Token->_M_node->_M_next;
  return UVar3;
}

Assistant:

Uint32 HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments(TokenListType::iterator& Token, const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                ^
    VERIFY_EXPR(Token->Type == TokenType::OpenParen);
    Uint32 NumArguments = 0;
    ProcessScope(
        Token, ScopeEnd, TokenType::OpenParen, TokenType::ClosingParen,
        [&](TokenListType::iterator& tkn, int ScopeDepth) {
            // Argument list is not empty, so there is at least one argument.
            if (NumArguments == 0)
                NumArguments = 1;
            // Number of additional arguments equals the number of commas
            // in scope depth 1

            // Do not count arguments of nested functions:
            // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
            //                                          ^
            //                                        ScopeDepth == 2
            if (ScopeDepth == 1 && tkn->Literal == ",")
                ++NumArguments;
            ++tkn;
        } //
    );
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                      ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while processing argument list");
    VERIFY_EXPR(Token->Type == TokenType::ClosingParen);
    ++Token;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    return NumArguments;
}